

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

wchar_t parse__escape(wchar_t **ptr)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  wchar_t local_94;
  int local_84;
  wchar_t ch;
  wchar_t cnt;
  wchar_t *h;
  wchar_t hex [17];
  int local_28;
  wchar_t local_24;
  wchar_t i;
  wint_t c;
  wchar_t *p;
  wchar_t **ptr_local;
  
  pwVar2 = *ptr;
  if (pwVar2[1] == L'\0') {
    return L'\xffffffff';
  }
  if (*pwVar2 == L'\\') {
    _i = pwVar2 + 1;
    switch(*_i) {
    case L'0':
    case L'1':
    case L'2':
    case L'3':
    case L'4':
    case L'5':
    case L'6':
    case L'7':
      local_24 = L'\0';
      for (local_84 = 0; local_84 < 3; local_84 = local_84 + 1) {
        wVar1 = *_i;
        if ((wVar1 < L'0') || (L'7' < wVar1)) break;
        local_24 = local_24 << 3 | wVar1 + L'\xffffffd0';
        _i = _i + 1;
      }
      if ((local_24 & 0xffffff00U) != 0) {
        return L'\xffffffff';
      }
      _i = _i + -1;
      break;
    default:
      local_24 = *_i;
      break;
    case L'U':
      memcpy(&h,L"0123456789ABCDEF",0x44);
      _i = pwVar2 + 3;
      if (pwVar2[2] != L'+') {
        return L'\xffffffff';
      }
      local_24 = L'\0';
      for (local_28 = 0; local_28 < 5; local_28 = local_28 + 1) {
        pwVar2 = wcschr((wchar_t *)&h,*_i);
        if ((pwVar2 == (wchar_t *)0x0) && (local_28 < 4)) {
          return L'\xffffffff';
        }
        if (pwVar2 != (wchar_t *)0x0) {
          local_24 = local_24 << 4 | (uint)((long)pwVar2 - (long)&h >> 2);
          _i = _i + 1;
        }
      }
      if (0x10ffff < (uint)local_24) {
        return L'\xffffffff';
      }
      break;
    case L'a':
      local_24 = L'\a';
      break;
    case L'b':
      local_24 = L'\b';
      break;
    case L'e':
      local_24 = L'\x1b';
      break;
    case L'f':
      local_24 = L'\f';
      break;
    case L'n':
      local_24 = L'\n';
      break;
    case L'r':
      local_24 = L'\r';
      break;
    case L't':
      local_24 = L'\t';
      break;
    case L'v':
      local_24 = L'\v';
    }
  }
  else if (*pwVar2 == L'^') {
    _i = pwVar2 + 1;
    if (*_i == L'?') {
      local_94 = L'\x7f';
    }
    else {
      local_94 = *_i & 0x9f;
    }
    local_24 = local_94;
  }
  else {
    local_24 = *pwVar2;
    _i = pwVar2;
  }
  *ptr = _i + 1;
  return local_24;
}

Assistant:

libedit_private int
parse__escape(const wchar_t **ptr)
{
	const wchar_t *p;
	wint_t c;

	p = *ptr;

	if (p[1] == 0)
		return -1;

	if (*p == '\\') {
		p++;
		switch (*p) {
		case 'a':
			c = '\007';	/* Bell */
			break;
		case 'b':
			c = '\010';	/* Backspace */
			break;
		case 't':
			c = '\011';	/* Horizontal Tab */
			break;
		case 'n':
			c = '\012';	/* New Line */
			break;
		case 'v':
			c = '\013';	/* Vertical Tab */
			break;
		case 'f':
			c = '\014';	/* Form Feed */
			break;
		case 'r':
			c = '\015';	/* Carriage Return */
			break;
		case 'e':
			c = '\033';	/* Escape */
			break;
		case 'U':		/* Unicode \U+xxxx or \U+xxxxx format */
		{
			int i;
			const wchar_t hex[] = L"0123456789ABCDEF";
			const wchar_t *h;
			++p;
			if (*p++ != '+')
				return -1;
			c = 0;
			for (i = 0; i < 5; ++i) {
				h = wcschr(hex, *p++);
				if (!h && i < 4)
					return -1;
				else if (h)
					c = (c << 4) | ((int)(h - hex));
				else
					--p;
			}
			if (c > 0x10FFFF) /* outside valid character range */
				return -1;
			break;
		}
		case '0':
		case '1':
		case '2':
		case '3':
		case '4':
		case '5':
		case '6':
		case '7':
		{
			int cnt, ch;

			for (cnt = 0, c = 0; cnt < 3; cnt++) {
				ch = *p++;
				if (ch < '0' || ch > '7') {
					p--;
					break;
				}
				c = (c << 3) | (ch - '0');
			}
			if ((c & (wint_t)0xffffff00) != (wint_t)0)
				return -1;
			--p;
			break;
		}
		default:
			c = *p;
			break;
		}
	} else if (*p == '^') {
		p++;
		c = (*p == '?') ? '\177' : (*p & 0237);
	} else
		c = *p;
	*ptr = ++p;
	return c;
}